

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliReader.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::read_escaped_word_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,fast_istringstream *is)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar3 = false;
LAB_001c86d0:
  pcVar2 = *(char **)this;
  if (pcVar2 == *(char **)(this + 8)) {
    return __return_storage_ptr__;
  }
  *(char **)this = pcVar2 + 1;
  cVar1 = *pcVar2;
  if (!bVar3) goto LAB_001c86f5;
  goto LAB_001c8707;
LAB_001c86f5:
  bVar3 = true;
  if (cVar1 != '\\') {
    if ((cVar1 == '=') || (cVar1 == ',')) {
      *(char **)this = pcVar2;
      return __return_storage_ptr__;
    }
LAB_001c8707:
    bVar3 = false;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  goto LAB_001c86d0;
}

Assistant:

inline std::string read_escaped_word(fast_istringstream& is)
{
    std::string w;
    w.reserve(32);
    bool escape = false;

    while (is.good()) {
        char c = is.get();

        if (escape) {
            w.push_back(c == 'n' ? '\n' : c);
            escape = false;
        } else {
            if (c == '=' || c == ',') {
                is.unget();
                break;
            } else if (c == '\\') {
                escape = true;
            } else {
                w.push_back(c);
            }
        }
    }

    return w;
}